

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratSmall.cpp
# Opt level: O0

void __thiscall
primesieve::EratSmall::storeSievingPrime
          (EratSmall *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  SievingPrime *sievingPrime_00;
  Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_> *this_00;
  size_t sVar1;
  SievingPrime *in_RCX;
  ulong in_RSI;
  size_t in_RDI;
  uint64_t sievingPrime;
  undefined1 local_48 [24];
  unsigned_long local_30 [2];
  undefined1 *local_20;
  undefined1 *n;
  Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_> *this_01;
  
  sievingPrime_00 = (SievingPrime *)(in_RSI / 0x1e);
  this_00 = (Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_> *)
            (in_RDI + 0x20);
  this_01 = (Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_> *)
            &stack0xffffffffffffffa8;
  n = local_48;
  local_20 = &stack0xffffffffffffffb0;
  if (*(long *)(in_RDI + 0x28) == *(long *)(in_RDI + 0x30)) {
    local_30[1] = 1;
    sVar1 = Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_>::capacity
                      (this_00);
    local_30[0] = sVar1 << 1;
    std::max<unsigned_long>(local_30 + 1,local_30);
    Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_>::reserve_unchecked
              (this_01,(size_t)n);
  }
  SievingPrime::SievingPrime(in_RCX,(size_t)sievingPrime_00,(size_t)this_00,in_RDI);
  this_00->end_ = this_00->end_ + 1;
  return;
}

Assistant:

void EratSmall::storeSievingPrime(uint64_t prime,
                                  uint64_t multipleIndex,
                                  uint64_t wheelIndex)
{
  ASSERT(prime <= maxPrime_);
  uint64_t sievingPrime = prime / 30;
  primes_.emplace_back(sievingPrime, multipleIndex, wheelIndex);
}